

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_gather2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  global_array_t *pgVar1;
  short sVar2;
  int iVar3;
  C_Integer *pCVar4;
  long lVar5;
  Integer IVar6;
  int iVar7;
  void *__ptr;
  logical lVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  undefined4 uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  void **ppvVar18;
  long lVar19;
  long *plVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  Integer IVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long icode;
  long lVar32;
  bool bVar33;
  armci_giov_t desc;
  Integer subscrpt [2];
  Integer hi [2];
  Integer lo [2];
  Integer _lo [2];
  char err_string [256];
  
  if (nv < 1) {
    return;
  }
  lVar32 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar32)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_gather");
    pnga_error(err_string,g_a);
  }
  if (GA[lVar32].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_gather");
    pnga_error(err_string,g_a);
  }
  GAstat.numgat = GAstat.numgat + 1;
  iVar3 = GA[lVar32].p_handle;
  lVar22 = (long)iVar3;
  if (lVar22 < 0) {
    lVar31 = GA[lVar32].num_rstrctd;
    if (GA[lVar32].num_rstrctd < 1) {
      lVar31 = GAnproc;
    }
  }
  else {
    lVar31 = (long)PGRP_LIST[lVar22].map_nproc;
  }
  if (GA[lVar32].distr_type == 0) {
    __ptr = malloc((nv << 0x20) + (lVar31 << 0x22) >> 0x1d);
    lVar30 = 0;
    lVar19 = lVar31;
  }
  else {
    lVar30 = GA[lVar32].block_total;
    __ptr = malloc((nv << 0x20) + (lVar30 << 0x22) >> 0x1d);
    lVar19 = lVar30;
  }
  if (__ptr == (void *)0x0) {
    pnga_error("malloc failed",lVar19 * 3);
    __ptr = (void *)0x0;
  }
  pgVar1 = GA;
  bVar33 = GA[lVar32].distr_type == 0;
  lVar19 = lVar30;
  if (bVar33) {
    lVar19 = lVar31;
  }
  lVar5 = lVar19 * 8 + nv * 8;
  if (bVar33) {
    if (0 < lVar31) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)__ptr + lVar15 * 8 + nv * 8) = 0;
        *(undefined8 *)((long)__ptr + lVar15 * 8 + lVar5) = 0;
        lVar15 = lVar15 + 1;
      } while (lVar31 != lVar15);
    }
  }
  else if (0 < lVar30) {
    lVar15 = 0;
    do {
      *(undefined8 *)((long)__ptr + lVar15 * 8 + nv * 8) = 0;
      *(undefined8 *)((long)__ptr + lVar15 * 8 + lVar5) = 0;
      lVar15 = lVar15 + 1;
    } while (lVar30 != lVar15);
  }
  IVar28 = 1;
  if (1 < nv) {
    IVar28 = nv;
  }
  if (pgVar1[lVar32].num_rstrctd == 0) {
    lVar15 = 0;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar15);
      subscrpt[1] = *(Integer *)((long)j + lVar15);
      lVar8 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar15));
      if (lVar8 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar15),
                *(undefined8 *)((long)j + lVar15));
        pnga_error(err_string,g_a);
      }
      plVar10 = (long *)((long)__ptr + *(Integer *)((long)__ptr + lVar15) * 8 + lVar5);
      *plVar10 = *plVar10 + 1;
      lVar15 = lVar15 + 8;
      IVar28 = IVar28 + -1;
    } while (IVar28 != 0);
  }
  else {
    lVar15 = 0;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar15);
      subscrpt[1] = *(Integer *)((long)j + lVar15);
      lVar8 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar15));
      if (lVar8 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar15),
                *(undefined8 *)((long)j + lVar15));
        pnga_error(err_string,g_a);
      }
      plVar10 = (long *)((long)__ptr +
                        GA[lVar32].rank_rstrctd[*(Integer *)((long)__ptr + lVar15)] * 8 + lVar5);
      *plVar10 = *plVar10 + 1;
      lVar15 = lVar15 + 8;
      IVar28 = IVar28 + -1;
    } while (IVar28 != 0);
  }
  lVar15 = lVar19 * 0x10 + nv * 8;
  lVar19 = lVar19 * 0x18 + nv * 8;
  if (GA[lVar32].distr_type == 0) {
    if (0 < lVar31) {
      lVar30 = 0;
      icode = 0;
      do {
        if (0 < *(long *)((long)__ptr + lVar30 * 8 + lVar5)) {
          *(long *)((long)__ptr + icode * 8 + lVar15) = lVar30;
          *(long *)((long)__ptr + lVar30 * 8 + lVar19) = icode;
          icode = icode + 1;
        }
        lVar30 = lVar30 + 1;
      } while (lVar31 != lVar30);
      goto LAB_00178666;
    }
  }
  else if (0 < lVar30) {
    lVar9 = 0;
    icode = 0;
    do {
      if (0 < *(long *)((long)__ptr + lVar9 * 8 + lVar5)) {
        *(long *)((long)__ptr + icode * 8 + lVar15) = lVar9;
        *(long *)((long)__ptr + lVar9 * 8 + lVar19) = icode;
        icode = icode + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar30 != lVar9);
    goto LAB_00178666;
  }
  icode = 0;
LAB_00178666:
  GAstat.numgat_procs = GAstat.numgat_procs + icode;
  lVar30 = nv * 0x10;
  plVar10 = (long *)malloc((long)((int)icode * 0x38 + (int)lVar30 + (int)(icode * 8)));
  if (plVar10 == (long *)0x0) {
    pnga_error("malloc failed",icode);
  }
  plVar20 = plVar10 + icode * 2;
  lVar9 = icode * 8 + lVar30;
  lVar24 = icode * 8 + lVar9;
  lVar12 = icode * 8 + lVar24;
  lVar11 = icode * 8 + lVar12;
  if (GA[lVar32].distr_type == 0) {
    if (0 < icode) {
      lVar30 = 0;
      do {
        lVar9 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
        if (0 < GA[lVar32].num_rstrctd) {
          lVar9 = GA[lVar32].rstrctd_list[lVar9];
        }
        pnga_distribution(g_a,lVar9,lo,hi);
        plVar20[nv * 2 + icode + lVar30] = lo[0];
        plVar20[nv * 2 + icode * 3 + lVar30] = lo[1];
        plVar20[nv * 2 + icode * 2 + lVar30] = hi[0];
        plVar20[nv * 2 + icode * 4 + lVar30] = hi[1];
        pgVar1 = GA + lVar32;
        lVar9 = GA[lVar32].width[0];
        lVar24 = GA[lVar32].width[1];
        lVar12 = GA[lVar32].num_rstrctd;
        iVar14 = GA[lVar32].distr_type;
        if (iVar14 - 1U < 3) {
          sVar2 = pgVar1->ndim;
          uVar25 = (uint)sVar2;
          lVar11 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
          uVar16 = (long)(int)lVar11 % pgVar1->num_blocks[0];
          uVar13 = (undefined4)uVar16;
          err_string[0] = (char)uVar13;
          err_string[1] = (char)((uint)uVar13 >> 8);
          err_string[2] = (char)((uint)uVar13 >> 0x10);
          err_string[3] = (char)((uint)uVar13 >> 0x18);
          if (1 < (int)uVar25) {
            uVar16 = uVar16 & 0xffffffff;
            lVar29 = 0;
            do {
              lVar11 = (long)((int)lVar11 - (int)uVar16) / GA[g_a + 1000].num_blocks[lVar29];
              uVar16 = (long)(int)lVar11 % GA[g_a + 1000].num_blocks[lVar29 + 1];
              *(int *)(err_string + lVar29 * 4 + 4) = (int)uVar16;
              lVar29 = lVar29 + 1;
            } while ((ulong)uVar25 - 1 != lVar29);
          }
          if (0 < sVar2) {
            lVar11 = 0;
            do {
              iVar14 = *(int *)(err_string + lVar11);
              lVar29 = *(long *)((long)GA[g_a + 1000].block_dims + lVar11 * 2);
              *(long *)((long)_lo + lVar11 * 2) = lVar29 * iVar14 + 1;
              lVar29 = ((long)iVar14 + 1) * lVar29;
              *(long *)((long)&desc.src_ptr_array + lVar11 * 2) = lVar29;
              lVar21 = *(long *)((long)GA[g_a + 1000].dims + lVar11 * 2);
              if (lVar21 <= lVar29) {
                lVar29 = lVar21;
              }
              *(long *)((long)&desc.src_ptr_array + lVar11 * 2) = lVar29;
              lVar11 = lVar11 + 4;
            } while ((ulong)uVar25 << 2 != lVar11);
          }
        }
        else if (iVar14 == 4) {
          sVar2 = pgVar1->ndim;
          uVar25 = (uint)sVar2;
          lVar11 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
          uVar16 = (long)(int)lVar11 % pgVar1->num_blocks[0];
          uVar13 = (undefined4)uVar16;
          err_string[0] = (char)uVar13;
          err_string[1] = (char)((uint)uVar13 >> 8);
          err_string[2] = (char)((uint)uVar13 >> 0x10);
          err_string[3] = (char)((uint)uVar13 >> 0x18);
          if (1 < (int)uVar25) {
            uVar16 = uVar16 & 0xffffffff;
            lVar29 = 0;
            do {
              lVar11 = (long)((int)lVar11 - (int)uVar16) / GA[g_a + 1000].num_blocks[lVar29];
              uVar16 = (long)(int)lVar11 % GA[g_a + 1000].num_blocks[lVar29 + 1];
              *(int *)(err_string + lVar29 * 4 + 4) = (int)uVar16;
              lVar29 = lVar29 + 1;
            } while ((ulong)uVar25 - 1 != lVar29);
          }
          if (0 < sVar2) {
            pCVar4 = GA[lVar32].mapc;
            lVar11 = 0;
            iVar14 = 0;
            do {
              iVar7 = *(int *)(err_string + lVar11);
              lVar29 = (long)iVar14 + (long)iVar7;
              *(C_Integer *)((long)_lo + lVar11 * 2) = pCVar4[lVar29];
              if ((long)iVar7 < *(long *)((long)pgVar1->num_blocks + lVar11 * 2) + -1) {
                lVar29 = pgVar1->mapc[lVar29 + 1] + -1;
              }
              else {
                lVar29 = *(long *)((long)pgVar1->dims + lVar11 * 2);
              }
              *(long *)((long)&desc.src_ptr_array + lVar11 * 2) = lVar29;
              iVar14 = iVar14 + *(int *)((long)pgVar1->num_blocks + lVar11 * 2);
              lVar11 = lVar11 + 4;
            } while ((ulong)uVar25 << 2 != lVar11);
          }
        }
        else if (iVar14 == 0) {
          if (lVar12 == 0) {
            lVar11 = (long)pgVar1->ndim;
            if (lVar11 < 1) {
              lVar29 = 1;
            }
            else {
              lVar29 = 1;
              lVar21 = 0;
              do {
                lVar29 = lVar29 * GA[g_a + 1000].nblock[lVar21];
                lVar21 = lVar21 + 1;
              } while (lVar11 != lVar21);
            }
            lVar21 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
            if (-1 < lVar21 && lVar21 < lVar29) {
              if (0 < pgVar1->ndim) {
                pCVar4 = pgVar1->mapc;
                lVar29 = 0;
                lVar23 = 0;
                do {
                  lVar27 = (long)GA[g_a + 1000].nblock[lVar29];
                  lVar17 = lVar21 % lVar27;
                  _lo[lVar29] = pCVar4[lVar17 + lVar23];
                  if (lVar17 == lVar27 + -1) {
                    ppvVar18 = (void **)GA[g_a + 1000].dims[lVar29];
                  }
                  else {
                    ppvVar18 = (void **)(pCVar4[lVar17 + lVar23 + 1] + -1);
                  }
                  lVar23 = lVar23 + lVar27;
                  (&desc.src_ptr_array)[lVar29] = ppvVar18;
                  lVar29 = lVar29 + 1;
                  lVar21 = lVar21 / lVar27;
                } while (lVar11 != lVar29);
              }
              goto LAB_00178c5c;
            }
          }
          else {
            lVar29 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
            sVar2 = pgVar1->ndim;
            lVar11 = (long)sVar2;
            if (lVar29 < lVar12) {
              if (sVar2 < 1) {
                lVar21 = 1;
              }
              else {
                lVar21 = 1;
                lVar23 = 0;
                do {
                  lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar23];
                  lVar23 = lVar23 + 1;
                } while (lVar11 != lVar23);
              }
              if ((-1 < lVar29) && (lVar29 < lVar21)) {
                if (0 < sVar2) {
                  pCVar4 = pgVar1->mapc;
                  lVar21 = 0;
                  lVar23 = 0;
                  do {
                    lVar27 = (long)GA[g_a + 1000].nblock[lVar23];
                    lVar17 = lVar29 % lVar27;
                    _lo[lVar23] = pCVar4[lVar17 + lVar21];
                    if (lVar17 == lVar27 + -1) {
                      ppvVar18 = (void **)GA[g_a + 1000].dims[lVar23];
                    }
                    else {
                      ppvVar18 = (void **)(pCVar4[lVar17 + lVar21 + 1] + -1);
                    }
                    lVar21 = lVar21 + lVar27;
                    (&desc.src_ptr_array)[lVar23] = ppvVar18;
                    lVar23 = lVar23 + 1;
                    lVar29 = lVar29 / lVar27;
                  } while (lVar11 != lVar23);
                }
                goto LAB_00178c5c;
              }
            }
          }
          if (0 < (short)lVar11) {
            memset(_lo,0,lVar11 << 3);
            memset(&desc,0xff,lVar11 << 3);
          }
        }
LAB_00178c5c:
        IVar6 = _lo[1];
        IVar28 = _lo[0];
        ppvVar18 = desc.src_ptr_array;
        if (pgVar1->p_handle == 0) {
          lVar11 = (long)PGRP_LIST->inv_map_proc_list[*(long *)((long)__ptr + lVar30 * 8 + lVar15)];
        }
        else {
          lVar11 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
          if (lVar12 != 0) {
            lVar11 = pgVar1->rstrctd_list[lVar11];
          }
        }
        lVar12 = plVar20[nv * 2 + icode + lVar30];
        if (((long)desc.src_ptr_array < lVar12 || lVar12 < _lo[0]) ||
           ((long)desc.dst_ptr_array < plVar20[nv * 2 + icode * 3 + lVar30] ||
            plVar20[nv * 2 + icode * 3 + lVar30] < _lo[1])) {
          sprintf(err_string,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
                  *(undefined8 *)((long)__ptr + lVar30 * 8 + lVar15),lVar12,
                  plVar20[nv * 2 + icode * 3 + lVar30],_lo[0],desc.src_ptr_array,_lo[1],
                  desc.dst_ptr_array);
          pnga_error(err_string,g_a);
        }
        lVar12 = ((lVar9 * 2 + 1) - IVar28) + (long)ppvVar18;
        plVar20[nv * 2 + lVar30] =
             (long)(GA[lVar32].ptr[lVar11] +
                   ((lVar9 - IVar28) + plVar20[nv * 2 + icode + lVar30] +
                   ((lVar24 - IVar6) + plVar20[nv * 2 + icode * 3 + lVar30]) * lVar12) *
                   *(long *)(BYTE_ARRAY_001d3551 + (long)GA[lVar32].type * 0x10 + 0x57));
        plVar20[nv * 2 + icode * 5 + lVar30] = lVar12;
        lVar30 = lVar30 + 1;
      } while (lVar30 != icode);
    }
  }
  else if (0 < icode) {
    lVar21 = 0;
    lVar29 = icode;
    do {
      IVar28 = *(Integer *)((long)__ptr + lVar21 + lVar15);
      pnga_distribution(g_a,IVar28,lo,hi);
      *(Integer *)((long)plVar20 + lVar21 + lVar9) = lo[0];
      *(Integer *)((long)plVar20 + lVar21 + lVar12) = lo[1];
      *(Integer *)((long)plVar20 + lVar21 + lVar24) = hi[0];
      *(Integer *)((long)plVar20 + lVar21 + lVar11) = hi[1];
      pnga_access_block_ptr
                (g_a,IVar28,(void *)((long)plVar20 + lVar21 + lVar30),
                 (Integer *)((long)plVar20 + lVar21 + icode * 8 + lVar11));
      lVar21 = lVar21 + 8;
      lVar29 = lVar29 + -1;
    } while (lVar29 != 0);
  }
  iVar14 = GA[lVar32].elemsize;
  GAbytes.gattot = (double)iVar14 * (double)nv + GAbytes.gattot;
  GAbytes.gatloc =
       (double)iVar14 *
       (double)*(long *)((long)__ptr + *(long *)((long)__ptr + GAme * 8) * 8 + lVar5) +
       GAbytes.gatloc;
  *plVar10 = (long)plVar20;
  plVar10[icode] = (long)(plVar20 + nv);
  if (1 < icode) {
    lVar30 = *plVar10;
    lVar9 = plVar10[icode];
    lVar24 = 0;
    do {
      lVar12 = *(long *)((long)__ptr + *(long *)((long)__ptr + lVar24 * 8 + lVar15) * 8 + lVar5);
      lVar30 = lVar30 + lVar12 * 8;
      plVar10[lVar24 + 1] = lVar30;
      lVar9 = lVar9 + lVar12 * 8;
      plVar10[icode + lVar24 + 1] = lVar9;
      lVar24 = lVar24 + 1;
    } while (icode + -1 != lVar24);
  }
  lVar30 = 1;
  if (1 < nv) {
    lVar30 = nv;
  }
  lVar9 = 0;
  do {
    lVar24 = *(long *)((long)__ptr + lVar9 * 8);
    if (0 < GA[lVar32].num_rstrctd) {
      lVar24 = GA[lVar32].rank_rstrctd[lVar24];
    }
    lVar12 = *(long *)((long)__ptr + lVar24 * 8 + nv * 8);
    *(long *)((long)__ptr + lVar24 * 8 + nv * 8) = lVar12 + 1;
    uVar16 = *(ulong *)((long)__ptr + lVar24 * 8 + lVar19);
    *(void **)(plVar10[icode + uVar16] + lVar12 * 8) = v;
    lVar24 = i[lVar9];
    if ((((lVar24 < plVar20[nv * 2 + icode + uVar16]) ||
         (plVar20[nv * 2 + icode * 2 + uVar16] < lVar24)) ||
        (j[lVar9] < plVar20[nv * 2 + icode * 3 + uVar16])) ||
       (plVar20[nv * 2 + icode * 4 + uVar16] < j[lVar9])) {
      sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",uVar16 & 0xffffffff,
              lVar24,j[lVar9],plVar20[nv * 2 + icode + uVar16],plVar20[nv * 2 + icode * 2 + uVar16],
              plVar20[nv * 2 + icode * 3 + uVar16],plVar20[nv * 2 + icode * 4 + uVar16]);
      pnga_error(err_string,g_a);
    }
    *(Integer *)(plVar10[uVar16] + lVar12 * 8) =
         (((j[lVar9] - plVar20[nv * 2 + icode * 3 + uVar16]) * plVar20[nv * 2 + icode * 5 + uVar16]
          + i[lVar9]) - plVar20[nv * 2 + icode + uVar16]) * (long)iVar14 + plVar20[nv * 2 + uVar16];
    lVar9 = lVar9 + 1;
    v = (void *)((long)v + (long)iVar14);
  } while (lVar30 != lVar9);
  switch(GA[lVar32].distr_type) {
  case 0:
    if (0 < icode) {
      lVar31 = 0;
      do {
        desc.src_ptr_array = (void **)plVar10[lVar31];
        desc.dst_ptr_array = (void **)plVar10[icode + lVar31];
        uVar16 = *(ulong *)((long)__ptr + lVar31 * 8 + lVar15);
        desc.ptr_array_len = *(int *)((long)__ptr + uVar16 * 8 + lVar5);
        if (iVar3 < 0) {
          if (0 < GA[lVar32].num_rstrctd) {
            uVar16 = GA[lVar32].rstrctd_list[uVar16];
          }
        }
        else {
          uVar16 = (ulong)(uint)PGRP_LIST[lVar22].inv_map_proc_list[uVar16];
        }
        desc.bytes = iVar14;
        iVar7 = ARMCI_GetV(&desc,1,(int)uVar16);
        if (iVar7 != 0) {
          pnga_error("gather failed in armci",(long)iVar7);
        }
        lVar31 = lVar31 + 1;
      } while (icode != lVar31);
    }
    break;
  case 1:
    if (0 < icode) {
      lVar32 = 0;
      do {
        desc.src_ptr_array = (void **)plVar10[lVar32];
        desc.dst_ptr_array = (void **)plVar10[icode + lVar32];
        lVar30 = *(long *)((long)__ptr + lVar32 * 8 + lVar15);
        uVar16 = lVar30 % lVar31;
        desc.ptr_array_len = *(int *)((long)__ptr + lVar30 * 8 + lVar5);
        if (-1 < iVar3) {
          uVar16 = (ulong)(uint)PGRP_LIST[lVar22].inv_map_proc_list[uVar16];
        }
        desc.bytes = iVar14;
        iVar7 = ARMCI_GetV(&desc,1,(int)uVar16);
        if (iVar7 != 0) {
          pnga_error("gather failed in armci",(long)iVar7);
        }
        lVar32 = lVar32 + 1;
      } while (icode != lVar32);
    }
    break;
  case 2:
    if (0 < icode) {
      lVar31 = 0;
      do {
        desc.src_ptr_array = (void **)plVar10[lVar31];
        desc.dst_ptr_array = (void **)plVar10[icode + lVar31];
        lVar30 = *(long *)((long)__ptr + lVar31 * 8 + lVar15);
        desc.ptr_array_len = *(int *)((long)__ptr + lVar30 * 8 + lVar5);
        sVar2 = GA[lVar32].ndim;
        uVar25 = (uint)sVar2;
        lVar19 = (long)(int)lVar30 % GA[lVar32].num_blocks[0];
        if (1 < (int)uVar25) {
          lVar24 = 0;
          lVar9 = lVar19;
          do {
            lVar30 = ((int)lVar30 - lVar9) / GA[g_a + 1000].num_blocks[lVar24];
            lVar9 = (long)(int)lVar30 % GA[g_a + 1000].num_blocks[lVar24 + 1];
            *(long *)(err_string + lVar24 * 8 + 8) = lVar9;
            lVar24 = lVar24 + 1;
          } while ((ulong)uVar25 - 1 != lVar24);
        }
        err_string._0_8_ = lVar19 % (long)GA[lVar32].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar32].nblock[1];
        if (0 < sVar2) {
          uVar16 = 0;
          do {
            _lo[uVar16] = *(long *)(err_string + uVar16 * 8) % (long)GA[g_a + 1000].nblock[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar25 != uVar16);
        }
        uVar16 = _lo[(long)(int)uVar25 + -1];
        if (1 < sVar2) {
          uVar26 = (ulong)(uVar25 - 2);
          do {
            uVar16 = (long)GA[g_a + 1000].nblock[uVar26] * uVar16 + _lo[uVar26];
            bVar33 = 0 < (long)uVar26;
            uVar26 = uVar26 - 1;
          } while (bVar33);
        }
        if (-1 < iVar3) {
          uVar16 = (ulong)(uint)PGRP_LIST[lVar22].inv_map_proc_list[uVar16];
        }
        desc.bytes = iVar14;
        iVar7 = ARMCI_GetV(&desc,1,(int)uVar16);
        if (iVar7 != 0) {
          pnga_error("gather failed in armci",(long)iVar7);
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != icode);
    }
    break;
  case 3:
  case 4:
    if (0 < icode) {
      lVar31 = 0;
      do {
        desc.src_ptr_array = (void **)plVar10[lVar31];
        desc.dst_ptr_array = (void **)plVar10[icode + lVar31];
        lVar30 = *(long *)((long)__ptr + lVar31 * 8 + lVar15);
        desc.ptr_array_len = *(int *)((long)__ptr + lVar30 * 8 + lVar5);
        sVar2 = GA[lVar32].ndim;
        uVar25 = (uint)sVar2;
        lVar19 = (long)(int)lVar30 % GA[lVar32].num_blocks[0];
        if (1 < (int)uVar25) {
          lVar24 = 0;
          lVar9 = lVar19;
          do {
            lVar30 = ((int)lVar30 - lVar9) / GA[g_a + 1000].num_blocks[lVar24];
            lVar9 = (long)(int)lVar30 % GA[g_a + 1000].num_blocks[lVar24 + 1];
            *(long *)(err_string + lVar24 * 8 + 8) = lVar9;
            lVar24 = lVar24 + 1;
          } while ((ulong)uVar25 - 1 != lVar24);
        }
        err_string._0_8_ = lVar19 % (long)GA[lVar32].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar32].nblock[1];
        if (0 < sVar2) {
          uVar16 = 0;
          do {
            _lo[uVar16] = *(long *)(err_string + uVar16 * 8) % (long)GA[g_a + 1000].nblock[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar25 != uVar16);
        }
        uVar16 = _lo[(long)(int)uVar25 + -1];
        if (1 < sVar2) {
          uVar26 = (ulong)(uVar25 - 2);
          do {
            uVar16 = (long)GA[g_a + 1000].nblock[uVar26] * uVar16 + _lo[uVar26];
            bVar33 = 0 < (long)uVar26;
            uVar26 = uVar26 - 1;
          } while (bVar33);
        }
        if (-1 < iVar3) {
          uVar16 = (ulong)(uint)PGRP_LIST[lVar22].inv_map_proc_list[uVar16];
        }
        desc.bytes = iVar14;
        iVar7 = ARMCI_GetV(&desc,1,(int)uVar16);
        if (iVar7 != 0) {
          pnga_error("gather failed in armci",(long)iVar7);
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != icode);
    }
  }
  free(plVar10);
  free(__ptr);
  return;
}

Assistant:

void pnga_gather2d(Integer g_a, void *v, Integer *i, Integer *j,
                         Integer nv)
{
    Integer k, kk, proc, item_size;
    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    Integer nproc, p_handle, iproc;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    Integer subscrpt[2];
    
    if (nv < 1) return;

    ga_check_handleM(g_a, "ga_gather");
    
    GAstat.numgat++;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }

    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int)(nproc *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int)(num_blocks *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
    
    owner = (Integer *)buf1; 
    count = owner+ nv;
    if (GA[handle].distr_type == REGULAR) {
      nelem = count + nproc;
      aproc = count + 2 * nproc;
      map =   count + 3 * nproc;
    } else {
      nelem = count + num_blocks;
      aproc = count + 2 * num_blocks;
      map =   count + 3 * num_blocks;
    }
   
    if (GA[handle].distr_type == REGULAR) {
      /* initialize the counters and nelem */
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }

    /* find proc or block that owns the (i,j) element; store it in temp: */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    GAstat.numgat_procs += naproc;
    
    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
          iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    item_size = GA[GA_OFFSET + g_a].elemsize;
    GAbytes.gattot += (double)item_size*nv;
    /*This stuff is probably completely wrong. Doesn't affect performance,
     * just statistics. */
    iproc = owner[GAme];
    GAbytes.gatloc += (double)item_size * nelem[iproc];

    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
          proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc]; 
        ptr_dst[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
                 (int)proc,(long)i[k],(long)j[k],
                 (long)ilo[proc],(long)ihi[proc],
                 (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_src[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);
}